

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::tick(optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this,
              float p_delta_time)

{
  float fVar1;
  element_type *peVar2;
  float *pfVar3;
  float fVar4;
  allocator<char> local_a9;
  string local_a8;
  Operation op;
  string local_58 [32];
  string local_38 [32];
  
  if ((this->m_compiled_game).prelude_info.realtime_interval.super__Optional_base<float,_true,_true>
      ._M_payload.super__Optional_payload_base<float>._M_engaged == false) {
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string(local_38,(string *)&m_engine_log_cat_abi_cxx11_);
      std::__cxx11::string::string<std::allocator<char>>
                (local_58,
                 "Trying to tick the engine but the loaded puzzlescript doesn\'t have realtime setup."
                 ,(allocator<char> *)&op);
      (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_38,local_58);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
      if ((this->m_config).log_operation_history_after_error == true) {
        print_operation_history(this);
      }
    }
    (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload.
    super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
    super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = false;
  }
  else {
    if ((this->m_config).add_ticks_to_operation_history == true) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
      Operation::Operation(&op,Undo,None,-1,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      op.delta_time = p_delta_time;
      std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::push_back
                (&this->m_operation_history,&op);
      std::__cxx11::string::~string((string *)&op.loaded_game_title);
    }
    pfVar3 = std::optional<float>::value(&(this->m_compiled_game).prelude_info.realtime_interval);
    fVar4 = p_delta_time + this->m_current_tick_time_elapsed;
    fVar1 = *pfVar3;
    this->m_current_tick_time_elapsed = fVar4;
    (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload.
    super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
    super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = false;
    while (fVar1 <= fVar4) {
      this->m_current_tick_time_elapsed = fVar4 - fVar1;
      next_turn((optional<PSEngine::TurnHistory> *)&op,this);
      std::_Optional_payload_base<PSEngine::TurnHistory>::_M_move_assign
                ((_Optional_payload_base<PSEngine::TurnHistory> *)__return_storage_ptr__,
                 (_Optional_payload_base<PSEngine::TurnHistory> *)&op);
      std::_Optional_payload_base<PSEngine::TurnHistory>::_M_reset
                ((_Optional_payload_base<PSEngine::TurnHistory> *)&op);
      fVar4 = this->m_current_tick_time_elapsed;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::tick(float p_delta_time)
{
    if(!m_compiled_game.prelude_info.realtime_interval.has_value())
    {
        PS_LOG_ERROR("Trying to tick the engine but the loaded puzzlescript doesn't have realtime setup.");
        return nullopt;
    }

    if(m_config.add_ticks_to_operation_history)
    {
        Operation op = Operation(OperationType::Undo);
        op.delta_time = p_delta_time;
        m_operation_history.push_back(op);
    }


    float realtime_interval = m_compiled_game.prelude_info.realtime_interval.value();

    m_current_tick_time_elapsed += p_delta_time;

    optional<TurnHistory> result = nullopt;

    while(m_current_tick_time_elapsed >= realtime_interval)
    {
        m_current_tick_time_elapsed -= realtime_interval;
        result = next_turn();
    }

    return result; //todo ? only yhe last one will be return if several turns happened during the same tick
}